

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

void soplex::MPSreadRhs(MPSInput *mps,
                       LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       *rset,NameSet *rnames,SPxOut *spxout)

{
  bool bVar1;
  Verbosity VVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  double *pdVar6;
  SPxOut *in_RCX;
  MPSInput *in_RDI;
  double dVar7;
  Verbosity old_verbosity_3;
  exception *e_1;
  Verbosity old_verbosity_2;
  exception *e;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  Rational val;
  int idx;
  char addname [256];
  char rhsname [256];
  undefined4 in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  MPSInput *in_stack_fffffffffffffb70;
  NameSet *in_stack_fffffffffffffb78;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffb80;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffb88;
  MPSInput *in_stack_fffffffffffffb90;
  MPSInput *in_stack_fffffffffffffc08;
  undefined4 local_2f8;
  Verbosity local_2f4 [26];
  int local_28c;
  char local_288 [256];
  char local_188 [136];
  char *in_stack_ffffffffffffff00;
  
  memset(local_188,0,0x100);
  memset(local_288,0,0x100);
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x1aaacc);
  do {
    bVar1 = MPSInput::readLine(in_stack_fffffffffffffc08);
    if (!bVar1) {
LAB_001ab644:
      MPSInput::syntaxError(in_stack_fffffffffffffb70);
      local_2f4[1] = 0;
LAB_001ab65e:
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x1ab66b);
      return;
    }
    pcVar4 = MPSInput::field0(in_RDI);
    if (pcVar4 != (char *)0x0) {
      if ((in_RCX != (SPxOut *)0x0) && (VVar2 = SPxOut::getVerbosity(in_RCX), 3 < (int)VVar2)) {
        local_2f4[3] = SPxOut::getVerbosity(in_RCX);
        local_2f4[2] = 4;
        (*in_RCX->_vptr_SPxOut[2])(in_RCX,local_2f4 + 2);
        operator<<((SPxOut *)in_stack_fffffffffffffb70,
                   (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        operator<<((SPxOut *)in_stack_fffffffffffffb70,
                   (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        operator<<((SPxOut *)in_stack_fffffffffffffb70,
                   (_func_ostream_ptr_ostream_ptr *)
                   CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        (*in_RCX->_vptr_SPxOut[2])(in_RCX,local_2f4 + 3);
      }
      pcVar4 = MPSInput::field0(in_RDI);
      iVar3 = strcmp(pcVar4,"RANGES");
      if (iVar3 == 0) {
        MPSInput::setSection(in_RDI,RANGES);
      }
      else {
        pcVar4 = MPSInput::field0(in_RDI);
        iVar3 = strcmp(pcVar4,"BOUNDS");
        if (iVar3 == 0) {
          MPSInput::setSection(in_RDI,BOUNDS);
        }
        else {
          pcVar4 = MPSInput::field0(in_RDI);
          iVar3 = strcmp(pcVar4,"ENDATA");
          if (iVar3 != 0) goto LAB_001ab644;
          MPSInput::setSection(in_RDI,ENDATA);
        }
      }
      local_2f4[1] = 1;
      goto LAB_001ab65e;
    }
    pcVar4 = MPSInput::field2(in_RDI);
    if (((pcVar4 != (char *)0x0) && (pcVar4 = MPSInput::field3(in_RDI), pcVar4 == (char *)0x0)) ||
       ((pcVar4 = MPSInput::field4(in_RDI), pcVar4 != (char *)0x0 &&
        (pcVar4 = MPSInput::field5(in_RDI), pcVar4 == (char *)0x0)))) {
      MPSInput::insertName(in_RDI,"_RHS_",false);
    }
    pcVar4 = MPSInput::field1(in_RDI);
    if (((pcVar4 == (char *)0x0) || (pcVar4 = MPSInput::field2(in_RDI), pcVar4 == (char *)0x0)) ||
       (pcVar4 = MPSInput::field3(in_RDI), pcVar4 == (char *)0x0)) goto LAB_001ab644;
    if (local_188[0] == '\0') {
      pcVar4 = local_188;
      pcVar5 = MPSInput::field1(in_RDI);
      spxSnprintf(pcVar4,0x100,"%s",pcVar5);
    }
    pcVar4 = local_188;
    pcVar5 = MPSInput::field1(in_RDI);
    iVar3 = strcmp(pcVar4,pcVar5);
    if (iVar3 == 0) {
      MPSInput::field2(in_RDI);
      local_28c = NameSet::number(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
      if (local_28c < 0) {
        in_stack_fffffffffffffc08 = (MPSInput *)MPSInput::field1(in_RDI);
        MPSInput::field2(in_RDI);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                   (char *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,
                   (char *)in_stack_fffffffffffffb70);
      }
      else {
        MPSInput::field3(in_RDI);
        ratFromString(in_stack_ffffffffffffff00);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)in_stack_fffffffffffffb70,
                    (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                     *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1ab023);
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::rhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
        dVar7 = boost::multiprecision::number::operator_cast_to_double
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1ab18f);
        pdVar6 = (double *)infinity();
        if (dVar7 < *pdVar6) {
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffffb70,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        }
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
        dVar7 = boost::multiprecision::number::operator_cast_to_double
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1ab22f);
        pdVar6 = (double *)infinity();
        if (-*pdVar6 < dVar7) {
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffffb70,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
        }
      }
      pcVar4 = MPSInput::field5(in_RDI);
      if (pcVar4 != (char *)0x0) {
        MPSInput::field4(in_RDI);
        local_28c = NameSet::number(in_stack_fffffffffffffb78,(char *)in_stack_fffffffffffffb70);
        if (local_28c < 0) {
          MPSInput::field1(in_RDI);
          MPSInput::field4(in_RDI);
          MPSInput::entryIgnored
                    (in_stack_fffffffffffffb90,(char *)in_stack_fffffffffffffb88,
                     (char *)in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78,
                     (char *)in_stack_fffffffffffffb70);
        }
        else {
          MPSInput::field5(in_RDI);
          ratFromString(in_stack_ffffffffffffff00);
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)in_stack_fffffffffffffb70,
                      (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                       *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1ab3b8);
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::rhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
          in_stack_fffffffffffffb90 =
               (MPSInput *)
               boost::multiprecision::number::operator_cast_to_double
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)0x1ab518);
          pdVar6 = (double *)infinity();
          if ((double)in_stack_fffffffffffffb90 < *pdVar6) {
            in_stack_fffffffffffffb88 =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffffb70,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          }
          in_stack_fffffffffffffb80 =
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
          in_stack_fffffffffffffb78 =
               (NameSet *)
               boost::multiprecision::number::operator_cast_to_double
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)0x1ab5b2);
          pdVar6 = (double *)infinity();
          if (-*pdVar6 < (double)in_stack_fffffffffffffb78) {
            in_stack_fffffffffffffb70 =
                 (MPSInput *)
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)in_stack_fffffffffffffb70,
                        (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                         *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          }
        }
      }
    }
    else {
      pcVar4 = MPSInput::field1(in_RDI);
      iVar3 = strcmp(local_288,pcVar4);
      if (iVar3 != 0) {
        pcVar4 = MPSInput::field1(in_RDI);
        spxSnprintf(local_288,0x100,"%s",pcVar4);
        if ((in_RCX != (SPxOut *)0x0) && (VVar2 = SPxOut::getVerbosity(in_RCX), 4 < (int)VVar2)) {
          local_2f4[0] = SPxOut::getVerbosity(in_RCX);
          local_2f8 = 5;
          (*in_RCX->_vptr_SPxOut[2])(in_RCX,&local_2f8);
          operator<<((SPxOut *)in_stack_fffffffffffffb70,
                     (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          operator<<((SPxOut *)in_stack_fffffffffffffb70,
                     (char *)CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          operator<<((SPxOut *)in_stack_fffffffffffffb70,
                     (_func_ostream_ptr_ostream_ptr *)
                     CONCAT44(in_stack_fffffffffffffb6c,in_stack_fffffffffffffb68));
          (*in_RCX->_vptr_SPxOut[2])(in_RCX,local_2f4);
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadRhs(MPSInput& mps, LPRowSetBase<Rational>& rset, const NameSet& rnames,
                       SPxOut* spxout)
{
   char rhsname[MPSInput::MAX_LINE_LEN] = { '\0' };
   char addname[MPSInput::MAX_LINE_LEN] = { '\0' };
   int idx;
   Rational val;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD03 RHS name       : " << rhsname  << std::endl;);

         if(!strcmp(mps.field0(), "RANGES"))
            mps.setSection(MPSInput::RANGES);
         else if(!strcmp(mps.field0(), "BOUNDS"))
            mps.setSection(MPSInput::BOUNDS);
         else if(!strcmp(mps.field0(), "ENDATA"))
            mps.setSection(MPSInput::ENDATA);
         else
            break;

         return;
      }

      if(((mps.field2() != nullptr) && (mps.field3() == nullptr)) || ((mps.field4() != nullptr)
            && (mps.field5() == nullptr)))
         mps.insertName("_RHS_");

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      if(*rhsname == '\0')
         spxSnprintf(rhsname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());

      if(strcmp(rhsname, mps.field1()))
      {
         if(strcmp(addname, mps.field1()))
         {
            assert(strlen(mps.field1()) < MPSInput::MAX_LINE_LEN);
            spxSnprintf(addname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());
            SPX_MSG_INFO3((*spxout), (*spxout) << "IMPSRD07 RHS ignored    : " << addname << std::endl);
         }
      }
      else
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("RHS", mps.field1(), "row", mps.field2());
         else
         {
            try
            {
               val = ratFromString(mps.field3());
            }
            catch(const std::exception& e)
            {
               SPX_MSG_WARNING((*spxout), (*spxout) << "WMPSRD03 Warning: malformed rational value in MPS file\n");
               std::cerr << e.what() << '\n';
            }

            // LE or EQ
            if(double(rset.rhs(idx)) < double(infinity))
               rset.rhs_w(idx) = val;

            // GE or EQ
            if(double(rset.lhs(idx)) > double(-infinity))
               rset.lhs_w(idx) = val;
         }

         if(mps.field5() != nullptr)
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("RHS", mps.field1(), "row", mps.field4());
            else
            {
               try
               {
                  val = ratFromString(mps.field5());
               }
               catch(const std::exception& e)
               {
                  SPX_MSG_WARNING((*spxout), (*spxout) << "WMPSRD04 Warning: malformed rational value in MPS file\n");
                  std::cerr << e.what() << '\n';
               }

               // LE or EQ
               if(double(rset.rhs(idx)) < double(infinity))
                  rset.rhs_w(idx) = val;

               // GE or EQ
               if(double(rset.lhs(idx)) > double(-infinity))
                  rset.lhs_w(idx) = val;
            }
         }
      }
   }

   mps.syntaxError();
}